

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

int __thiscall
ut::setup_impl<agge::tests::PathJoningTests>::init
          (setup_impl<agge::tests::PathJoningTests> *this,EVP_PKEY_CTX *ctx)

{
  const_iterator cVar1;
  bool bVar2;
  undefined7 extraout_var;
  reference poVar3;
  code *local_50;
  __normal_iterator<void_(agge::tests::PathJoningTests::*const_*)(),_std::vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>_>
  local_28;
  __normal_iterator<void_(agge::tests::PathJoningTests::*const_*)(),_std::vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>_>
  local_20;
  const_iterator i;
  PathJoningTests *fixture_local;
  setup_impl<agge::tests::PathJoningTests> *this_local;
  
  i._M_current = (offset_in_PathJoningTests_to_subr *)ctx;
  local_20._M_current =
       (offset_in_PathJoningTests_to_subr *)
       std::
       vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>
       ::begin(&this->_inits);
  while( true ) {
    local_28._M_current =
         (offset_in_PathJoningTests_to_subr *)
         std::
         vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>
         ::end(&this->_inits);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    cVar1 = i;
    if (!bVar2) break;
    poVar3 = __gnu_cxx::
             __normal_iterator<void_(agge::tests::PathJoningTests::*const_*)(),_std::vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>_>
             ::operator*(&local_20);
    local_50 = (code *)*poVar3;
    if (((ulong)local_50 & 1) != 0) {
      local_50 = *(code **)(local_50 + *(long *)((long)cVar1._M_current + poVar3[1]) + -1);
    }
    (*local_50)((long *)((long)cVar1._M_current + poVar3[1]));
    __gnu_cxx::
    __normal_iterator<void_(agge::tests::PathJoningTests::*const_*)(),_std::vector<void_(agge::tests::PathJoningTests::*)(),_std::allocator<void_(agge::tests::PathJoningTests::*)()>_>_>
    ::operator++(&local_20);
  }
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

inline void setup_impl<Fixture>::init(Fixture &fixture) const
	{
		for (typename methods_list_t::const_iterator i = _inits.begin(); i != _inits.end(); ++i)
			(fixture.**i)();
	}